

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::parsing::TokenKind>::emplace_back<slang::parsing::TokenKind_const&>
          (SmallVectorBase<slang::parsing::TokenKind> *this,TokenKind *args)

{
  size_type sVar1;
  pointer pTVar2;
  
  sVar1 = this->len;
  pTVar2 = this->data_ + sVar1;
  if (sVar1 == this->cap) {
    pTVar2 = emplaceRealloc<slang::parsing::TokenKind_const&>(this,pTVar2,args);
    return pTVar2;
  }
  this->data_[sVar1] = *args;
  this->len = sVar1 + 1;
  return pTVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }